

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.cpp
# Opt level: O0

unique_ptr<Event,_std::default_delete<Event>_> * __thiscall Events::onPeerDisconnect(Events *this)

{
  unique_ptr<Event,_std::default_delete<Event>_> *puVar1;
  allocator<char> local_31;
  string local_30;
  Events *local_10;
  Events *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"onPeerDisconnect",&local_31);
  puVar1 = EventRegister::on(&this->super_EventRegister,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return puVar1;
}

Assistant:

const std::unique_ptr<Event> &Events::onPeerDisconnect()
{
    return this->on("onPeerDisconnect");
}